

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjEncodeYUV3(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelFormat,
                uchar *dstBuf,int pad,int subsamp,int flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  tjinstance *this;
  long in_FS_OFFSET;
  int strides [3];
  uchar *dstPlanes [3];
  uint local_54;
  uint local_50;
  uint local_4c;
  uchar *local_48;
  uchar *local_40;
  uchar *local_38;
  
  if (handle == (tjhandle)0x0) {
    builtin_strncpy((char *)(in_FS_OFFSET + -0xc1)," Invalid",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xb9)," handle",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjEncode",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -200),"YUV3(): ",8);
    return -1;
  }
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  if ((-1 < pad && (dstBuf != (uchar *)0x0 && (0 < height && 0 < width))) &&
     ((pad & pad - 1U) == 0 && (uint)subsamp < 6)) {
    iVar1 = tjPlaneWidth(0,width,subsamp);
    iVar2 = tjPlaneHeight(0,height,subsamp);
    local_48 = dstBuf;
    uVar4 = (iVar1 + pad) - 1U & -pad;
    local_54 = uVar4;
    if (subsamp == 3) {
      local_38 = (uchar *)0x0;
      local_40 = (uchar *)0x0;
      local_50 = 0;
    }
    else {
      iVar1 = tjPlaneWidth(1,width,subsamp);
      iVar3 = tjPlaneHeight(1,height,subsamp);
      local_50 = (pad - 1U) + iVar1 & -pad;
      local_40 = dstBuf + (int)(uVar4 * iVar2);
      local_38 = local_40 + (int)(iVar3 * local_50);
    }
    local_4c = local_50;
    iVar1 = tjEncodeYUVPlanes(handle,srcBuf,width,pitch,height,pixelFormat,&local_48,
                              (int *)&local_54,subsamp,flags);
    return iVar1;
  }
  builtin_strncpy((char *)((long)handle + 0x618),"Invalid ",8);
  builtin_strncpy((char *)((long)handle + 0x620),"argument",8);
  builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
  builtin_strncpy((char *)((long)handle + 0x610),"YUV3(): ",8);
  *(undefined1 *)((long)handle + 0x628) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 1;
  *(undefined1 *)(in_FS_OFFSET + -0xb0) = 0;
  builtin_strncpy((char *)(in_FS_OFFSET + -0xc0),"Invalid ",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xb8),"argument",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjEncode",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -200),"YUV3(): ",8);
  return -1;
}

Assistant:

DLLEXPORT int tjEncodeYUV3(tjhandle handle, const unsigned char *srcBuf,
                           int width, int pitch, int height, int pixelFormat,
                           unsigned char *dstBuf, int pad, int subsamp,
                           int flags)
{
  unsigned char *dstPlanes[3];
  int pw0, ph0, strides[3], retval = -1;
  tjinstance *this = (tjinstance *)handle;

  if (!this) THROWG("tjEncodeYUV3(): Invalid handle");
  this->isInstanceError = FALSE;

  if (width <= 0 || height <= 0 || dstBuf == NULL || pad < 0 ||
      !IS_POW2(pad) || subsamp < 0 || subsamp >= NUMSUBOPT)
    THROW("tjEncodeYUV3(): Invalid argument");

  pw0 = tjPlaneWidth(0, width, subsamp);
  ph0 = tjPlaneHeight(0, height, subsamp);
  dstPlanes[0] = dstBuf;
  strides[0] = PAD(pw0, pad);
  if (subsamp == TJSAMP_GRAY) {
    strides[1] = strides[2] = 0;
    dstPlanes[1] = dstPlanes[2] = NULL;
  } else {
    int pw1 = tjPlaneWidth(1, width, subsamp);
    int ph1 = tjPlaneHeight(1, height, subsamp);

    strides[1] = strides[2] = PAD(pw1, pad);
    dstPlanes[1] = dstPlanes[0] + strides[0] * ph0;
    dstPlanes[2] = dstPlanes[1] + strides[1] * ph1;
  }

  return tjEncodeYUVPlanes(handle, srcBuf, width, pitch, height, pixelFormat,
                           dstPlanes, strides, subsamp, flags);

bailout:
  return retval;
}